

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * Cudd_addPermute(DdManager *manager,DdNode *node,int *permut)

{
  DdHashTable *table_00;
  DdNode *pDVar1;
  DdNode *res;
  DdHashTable *table;
  int *permut_local;
  DdNode *node_local;
  DdManager *manager_local;
  
  do {
    manager->reordered = 0;
    table_00 = cuddHashTableInit(manager,1,2);
    if (table_00 == (DdHashTable *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar1 = cuddAddPermuteRecur(manager,table_00,node,permut);
    if (pDVar1 != (DdNode *)0x0) {
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    }
    cuddHashTableQuit(table_00);
  } while (manager->reordered == 1);
  if (pDVar1 != (DdNode *)0x0) {
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
  }
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addPermute(
  DdManager * manager,
  DdNode * node,
  int * permut)
{
    DdHashTable         *table;
    DdNode              *res;

    do {
        manager->reordered = 0;
        table = cuddHashTableInit(manager,1,2);
        if (table == NULL) return(NULL);
        /* Recursively solve the problem. */
        res = cuddAddPermuteRecur(manager,table,node,permut);
        if (res != NULL) cuddRef(res);
        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (manager->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}